

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

Node * prvTidyFindContainer(Node *node)

{
  Bool BVar1;
  Node *node_00;
  
  if (node != (Node *)0x0) {
    for (node_00 = node->parent; node_00 != (Node *)0x0; node_00 = node_00->parent) {
      BVar1 = prvTidynodeHasCM(node_00,0x10);
      if (BVar1 == no) {
        return node_00;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(FindContainer)( Node* node )
{
    for ( node = (node ? node->parent : NULL);
          node && TY_(nodeHasCM)(node, CM_INLINE);
          node = node->parent )
        /**/;

    return node;
}